

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ports.cpp
# Opt level: O3

void dump_ports_cb(Port *p,char *name,char *param_3,Ports *param_4,void *v,void *param_6)

{
  bool bVar1;
  MetaContainer MVar2;
  Port *pPVar3;
  size_type sVar4;
  int iVar5;
  int iVar6;
  iterator iVar7;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar8;
  size_t sVar9;
  ostream *poVar10;
  long lVar11;
  undefined1 uVar12;
  char *pcVar13;
  char *pcVar14;
  bool bVar15;
  MetaIterator MVar16;
  MetaIterator MVar17;
  MetaContainer meta;
  string doc;
  string local_f8;
  MetaContainer local_d8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_d0;
  allocator<char> local_c1;
  string local_c0;
  Port *local_a0;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_98;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_58;
  string local_50;
  
  local_58 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)name;
  if (dump_ports_cb(rtosc::Port_const*,char_const*,char_const*,rtosc::Ports_const&,void*,void*)::
      already_dumped_abi_cxx11_ == '\0') {
    dump_ports_cb();
  }
  paVar8 = local_58;
  local_f8._M_string_length = (size_type)p->name;
  local_f8._M_dataplus._M_p = (pointer)local_58;
  local_a0 = p;
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::pair<const_char_*,_const_char_*,_true>(&local_98,(pair<const_char_*,_const_char_*> *)&local_f8);
  iVar7 = std::
          _Rb_tree<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Identity<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::find(&dump_ports_cb(rtosc::Port_const*,char_const*,char_const*,rtosc::Ports_const&,void*,void*)
                  ::already_dumped_abi_cxx11_._M_t,&local_98);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98.second._M_dataplus._M_p != &local_98.second.field_2) {
    operator_delete(local_98.second._M_dataplus._M_p,
                    local_98.second.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98.first._M_dataplus._M_p != &local_98.first.field_2) {
    operator_delete(local_98.first._M_dataplus._M_p,
                    CONCAT71(local_98.first.field_2._M_allocated_capacity._1_7_,
                             local_98.first.field_2._M_local_buf[0]) + 1);
  }
  if ((_Rb_tree_header *)iVar7._M_node !=
      &dump_ports_cb(rtosc::Port_const*,char_const*,char_const*,rtosc::Ports_const&,void*,void*)::
       already_dumped_abi_cxx11_._M_t._M_impl.super__Rb_tree_header) {
    return;
  }
  pcVar13 = local_a0->metadata;
  local_d0 = paVar8;
  if ((pcVar13 != (char *)0x0) && (*pcVar13 == ':')) {
    pcVar13 = pcVar13 + 1;
  }
  rtosc::Port::MetaContainer::MetaContainer((MetaContainer *)&local_98,pcVar13);
  pPVar3 = local_a0;
  local_d8.str_ptr = local_98.first._M_dataplus._M_p;
  paVar8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)strchr(local_a0->name,0x3a);
  MVar16 = rtosc::Port::MetaContainer::find(&local_d8,"parameter");
  MVar17 = rtosc::Port::MetaContainer::find(&local_d8,"documentation");
  pcVar14 = MVar17.title;
  local_98.first._M_dataplus._M_p = (pointer)&local_98.first.field_2;
  local_98.first._M_string_length = 0;
  local_98.first.field_2._M_local_buf[0] = '\0';
  pcVar13 = pPVar3->metadata;
  if ((pcVar13 == (char *)0x0) || (*pcVar13 != ':')) {
    rtosc::Port::MetaContainer::MetaContainer((MetaContainer *)&local_f8,pcVar13);
  }
  else {
    rtosc::Port::MetaContainer::MetaContainer((MetaContainer *)&local_f8,pcVar13 + 1);
  }
  rtosc::Port::MetaIterator::MetaIterator((MetaIterator *)&local_f8,(char *)0x0);
  sVar4 = local_98.first._M_string_length;
  if (pcVar14 != local_f8._M_dataplus._M_p) {
    strlen(MVar17.value);
    std::__cxx11::string::_M_replace((ulong)&local_98,0,(char *)sVar4,(ulong)MVar17.value);
  }
  MVar17 = rtosc::Port::MetaContainer::find(&local_d8,"internal");
  rtosc::Port::MetaIterator::MetaIterator((MetaIterator *)&local_f8,(char *)0x0);
  if (MVar17.title != local_f8._M_dataplus._M_p) {
    std::__cxx11::string::append((char *)&local_98);
  }
  pcVar13 = local_a0->metadata;
  if ((pcVar13 == (char *)0x0) || (*pcVar13 != ':')) {
    rtosc::Port::MetaContainer::MetaContainer((MetaContainer *)&local_f8,pcVar13);
  }
  else {
    rtosc::Port::MetaContainer::MetaContainer((MetaContainer *)&local_f8,pcVar13 + 1);
  }
  rtosc::Port::MetaIterator::MetaIterator((MetaIterator *)&local_f8,(char *)0x0);
  if (MVar16.title == local_f8._M_dataplus._M_p) {
    rtosc::Port::MetaIterator::MetaIterator((MetaIterator *)&local_f8,(char *)0x0);
    if (pcVar14 == local_f8._M_dataplus._M_p) {
LAB_00108db9:
      rtosc::Port::MetaIterator::MetaIterator((MetaIterator *)&local_f8,(char *)0x0);
      if ((paVar8 == (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                      *)0x0) || (pcVar14 == local_f8._M_dataplus._M_p)) {
        rtosc::Port::MetaIterator::MetaIterator((MetaIterator *)&local_f8,(char *)0x0);
        if (pcVar14 == local_f8._M_dataplus._M_p) {
          pcVar13 = "Skipping [UNDOCUMENTED] \"%s\"\n";
          paVar8 = local_d0;
        }
        else {
          bVar1 = false;
          fprintf(_stderr,"Skipping \"%s\"\n",local_d0);
          if (paVar8 == (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)0x0) goto LAB_0010991f;
          pcVar13 = "    type = %s\n";
        }
        bVar1 = false;
        fprintf(_stderr,pcVar13,paVar8);
        goto LAB_0010991f;
      }
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_f8,local_d0->_M_local_buf,&local_c1);
      local_c0._M_dataplus._M_p = (pointer)&local_c0.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_c0,local_98.first._M_dataplus._M_p,
                 (char *)(local_98.first._M_string_length + (long)local_98.first._M_dataplus._M_p));
      local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
      sVar9 = strlen(paVar8->_M_local_buf);
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_50,paVar8,paVar8->_M_local_buf + sVar9);
      dump_generic_port((ostream *)v,&local_f8,&local_c0,&local_50);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2) {
        operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
      }
    }
    else {
      if (paVar8 != (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)0x0) {
        local_f8._M_string_length = 0;
        local_f8.field_2._M_local_buf[0] = '\0';
        local_f8._M_dataplus._M_p = (pointer)&local_f8.field_2;
        iVar6 = std::__cxx11::string::compare((char *)&local_f8);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_f8._M_dataplus._M_p != &local_f8.field_2) {
          operator_delete(local_f8._M_dataplus._M_p,
                          CONCAT71(local_f8.field_2._M_allocated_capacity._1_7_,
                                   local_f8.field_2._M_local_buf[0]) + 1);
        }
        if (iVar6 != 0) goto LAB_00108db9;
      }
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_f8,local_d0->_M_local_buf,(allocator<char> *)&local_50);
      local_c0._M_dataplus._M_p = (pointer)&local_c0.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_c0,local_98.first._M_dataplus._M_p,
                 (char *)(local_98.first._M_string_length + (long)local_98.first._M_dataplus._M_p));
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)v," <message_in pattern=\"",0x16);
      poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)v,local_f8._M_dataplus._M_p,local_f8._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar10,"\" typetag=\"*\">\n",0xf);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)v,"  <desc>",8);
      poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)v,local_c0._M_dataplus._M_p,local_c0._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar10,"</desc>\n",8);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)v," </message_in>\n",0xf);
    }
LAB_001092de:
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_c0._M_dataplus._M_p != &local_c0.field_2) {
      operator_delete(local_c0._M_dataplus._M_p,local_c0.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f8._M_dataplus._M_p != &local_f8.field_2) {
      operator_delete(local_f8._M_dataplus._M_p,
                      CONCAT71(local_f8.field_2._M_allocated_capacity._1_7_,
                               local_f8.field_2._M_local_buf[0]) + 1);
    }
    bVar1 = true;
    goto LAB_0010991f;
  }
  if (paVar8 == (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)0x0) {
LAB_00109cfb:
    dump_ports_cb();
    bVar1 = false;
    goto LAB_0010991f;
  }
  pcVar13 = strchr(paVar8->_M_local_buf,0x66);
  if (pcVar13 == (char *)0x0) {
    pcVar13 = strchr(paVar8->_M_local_buf,0x69);
    pcVar14 = "";
    if (pcVar13 != (char *)0x0) {
      uVar12 = 0x69;
      goto LAB_00108e91;
    }
    pcVar13 = strchr(paVar8->_M_local_buf,99);
    if (pcVar13 == (char *)0x0) {
      pcVar13 = strchr(paVar8->_M_local_buf,0x54);
      if (pcVar13 == (char *)0x0) {
        pcVar13 = strchr(paVar8->_M_local_buf,0x73);
        if (pcVar13 == (char *)0x0) goto LAB_00109cfb;
        uVar12 = 0x73;
        goto LAB_00108e91;
      }
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_f8,local_d0->_M_local_buf,(allocator<char> *)&local_50);
      local_c0._M_dataplus._M_p = (pointer)&local_c0.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_c0,local_98.first._M_dataplus._M_p,
                 (char *)(local_98.first._M_string_length + (long)local_98.first._M_dataplus._M_p));
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)v," <message_in pattern=\"",0x16);
      poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)v,local_f8._M_dataplus._M_p,local_f8._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar10,"\" typetag=\"T\">\n",0xf);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)v,"  <desc>Enable ",0xf);
      poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)v,local_c0._M_dataplus._M_p,local_c0._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar10,"</desc>\n",8);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)v,"  <param_T symbol=\"x\"/>\n",0x18);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)v," </message_in>\n",0xf);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)v," <message_in pattern=\"",0x16);
      poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)v,local_f8._M_dataplus._M_p,local_f8._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar10,"\" typetag=\"F\">\n",0xf);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)v,"  <desc>Disable ",0x10);
      poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)v,local_c0._M_dataplus._M_p,local_c0._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar10,"</desc>\n",8);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)v,"  <param_F symbol=\"x\"/>\n",0x18);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)v," </message_in>\n",0xf);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)v," <message_in pattern=\"",0x16);
      poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)v,local_f8._M_dataplus._M_p,local_f8._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar10,"\" typetag=\"\">\n",0xe);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)v,"  <desc>Get state of ",0x15);
      poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)v,local_c0._M_dataplus._M_p,local_c0._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar10,"</desc>\n",8);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)v," </message_in>\n",0xf);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)v," <message_out pattern=\"",0x17);
      poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)v,local_f8._M_dataplus._M_p,local_f8._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar10,"\" typetag=\"T\">\n",0xf);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)v,"  <desc>Value of ",0x11);
      poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)v,local_c0._M_dataplus._M_p,local_c0._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar10,"</desc>\n",8);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)v,"  <param_T symbol=\"x\"/>",0x17);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)v," </message_out>\n",0x10);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)v," <message_out pattern=\"",0x17);
      poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)v,local_f8._M_dataplus._M_p,local_f8._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar10,"\" typetag=\"F\">\n",0xf);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)v,"  <desc>Value of ",0x11);
      poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)v,local_c0._M_dataplus._M_p,local_c0._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar10,"</desc>\n",8);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)v,"  <param_F symbol=\"x\"/>",0x17);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)v," </message_out>\n",0x10);
      goto LAB_001092de;
    }
    uVar12 = 99;
    bVar1 = true;
  }
  else {
    uVar12 = 0x66;
    pcVar14 = "lmin=\"[\" lmax=\"]\"";
LAB_00108e91:
    bVar1 = false;
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)v," <message_in pattern=\"",0x16);
  paVar8 = local_d0;
  iVar6 = (int)v;
  if (local_d0 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)0x0) {
    std::ios::clear(iVar6 + (int)*(undefined8 *)(*v + -0x18));
  }
  else {
    sVar9 = strlen(local_d0->_M_local_buf);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)v,paVar8->_M_local_buf,sVar9);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)v,"\" typetag=\"",0xb);
  local_f8._M_dataplus._M_p._0_1_ = uVar12;
  poVar10 = std::__ostream_insert<char,std::char_traits<char>>((ostream *)v,(char *)&local_f8,1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar10,"\">\n",3);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)v,"  <desc>Set Value of ",0x15);
  poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)v,local_98.first._M_dataplus._M_p,local_98.first._M_string_length)
  ;
  std::__ostream_insert<char,std::char_traits<char>>(poVar10,"</desc>\n",8);
  MVar16 = rtosc::Port::MetaContainer::find(&local_d8,"min");
  rtosc::Port::MetaIterator::MetaIterator((MetaIterator *)&local_f8,(char *)0x0);
  if (MVar16.title == local_f8._M_dataplus._M_p) {
LAB_00108faf:
    MVar16 = rtosc::Port::MetaContainer::find(&local_d8,"enumerated");
    rtosc::Port::MetaIterator::MetaIterator((MetaIterator *)&local_f8,(char *)0x0);
    if (MVar16.title == local_f8._M_dataplus._M_p) {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)v,"  <param_",9);
      poVar10 = std::__ostream_insert<char,std::char_traits<char>>((ostream *)v,(char *)&local_f8,1)
      ;
      std::__ostream_insert<char,std::char_traits<char>>(poVar10," symbol=\"x\"",0xb);
      pcVar13 = rtosc::Port::MetaContainer::operator[](&local_d8,"unit");
      units((ostream *)v,pcVar13);
      lVar11 = 3;
      pcVar13 = "/>\n";
      poVar10 = (ostream *)v;
    }
    else {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)v,"  <param_",9);
      poVar10 = std::__ostream_insert<char,std::char_traits<char>>((ostream *)v,(char *)&local_f8,1)
      ;
      std::__ostream_insert<char,std::char_traits<char>>(poVar10," symbol=\"x\">\n",0xd);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)v,"    <range_min_max min=\"",0x18);
      MVar2.str_ptr = local_d8.str_ptr;
      iVar5 = enum_min(local_d8);
      poVar10 = (ostream *)std::ostream::operator<<((ostream *)v,iVar5);
      std::__ostream_insert<char,std::char_traits<char>>(poVar10,"\" max=\"",7);
      iVar5 = enum_max(MVar2);
      poVar10 = (ostream *)std::ostream::operator<<((ostream *)v,iVar5);
      std::__ostream_insert<char,std::char_traits<char>>(poVar10,"\">\n",3);
      add_options((ostream *)v,MVar2);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)v,"    </range_min_max>\n",0x15)
      ;
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)v,"  </param_",10);
      local_f8._M_dataplus._M_p._0_1_ = uVar12;
      poVar10 = std::__ostream_insert<char,std::char_traits<char>>((ostream *)v,(char *)&local_f8,1)
      ;
      lVar11 = 2;
      pcVar13 = ">\n";
    }
    std::__ostream_insert<char,std::char_traits<char>>(poVar10,pcVar13,lVar11);
  }
  else {
    MVar16 = rtosc::Port::MetaContainer::find(&local_d8,"max");
    rtosc::Port::MetaIterator::MetaIterator((MetaIterator *)&local_f8,(char *)0x0);
    bVar15 = MVar16.title != local_f8._M_dataplus._M_p;
    if (!bVar15 || bVar1) {
      bVar1 = (bool)(bVar1 | bVar15);
      goto LAB_00108faf;
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)v,"  <param_",9);
    poVar10 = std::__ostream_insert<char,std::char_traits<char>>((ostream *)v,(char *)&local_f8,1);
    std::__ostream_insert<char,std::char_traits<char>>(poVar10," symbol=\"x\"",0xb);
    pcVar13 = rtosc::Port::MetaContainer::operator[](&local_d8,"unit");
    units((ostream *)v,pcVar13);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)v,">\n",2);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)v,"   <range_min_max ",0x12);
    sVar9 = strlen(pcVar14);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)v,pcVar14,sVar9);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)v," min=\"",6);
    pcVar13 = rtosc::Port::MetaContainer::operator[](&local_d8,"min");
    if (pcVar13 == (char *)0x0) {
      std::ios::clear(iVar6 + (int)*(undefined8 *)(*v + -0x18));
    }
    else {
      sVar9 = strlen(pcVar13);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)v,pcVar13,sVar9);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)v,"\"  max=\"",8);
    pcVar13 = rtosc::Port::MetaContainer::operator[](&local_d8,"max");
    if (pcVar13 == (char *)0x0) {
      std::ios::clear(iVar6 + (int)*(undefined8 *)(*v + -0x18));
    }
    else {
      sVar9 = strlen(pcVar13);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)v,pcVar13,sVar9);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)v,"\"/>\n",4);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)v,"  </param_",10);
    poVar10 = std::__ostream_insert<char,std::char_traits<char>>((ostream *)v,(char *)&local_f8,1);
    std::__ostream_insert<char,std::char_traits<char>>(poVar10,">",1);
    bVar1 = false;
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)v," </message_in>\n",0xf);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)v," <message_in pattern=\"",0x16);
  paVar8 = local_d0;
  if (local_d0 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)0x0) {
    std::ios::clear(iVar6 + (int)*(undefined8 *)(*v + -0x18));
  }
  else {
    sVar9 = strlen(local_d0->_M_local_buf);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)v,paVar8->_M_local_buf,sVar9);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)v,"\" typetag=\"\">\n",0xe);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)v,"  <desc>Get Value of ",0x15);
  poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)v,local_98.first._M_dataplus._M_p,local_98.first._M_string_length)
  ;
  std::__ostream_insert<char,std::char_traits<char>>(poVar10,"</desc>\n",8);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)v," </message_in>\n",0xf);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)v," <message_out pattern=\"",0x17);
  paVar8 = local_d0;
  if (local_d0 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)0x0) {
    std::ios::clear(iVar6 + (int)*(undefined8 *)(*v + -0x18));
  }
  else {
    sVar9 = strlen(local_d0->_M_local_buf);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)v,paVar8->_M_local_buf,sVar9);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)v,"\" typetag=\"",0xb);
  local_f8._M_dataplus._M_p._0_1_ = uVar12;
  poVar10 = std::__ostream_insert<char,std::char_traits<char>>((ostream *)v,(char *)&local_f8,1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar10,"\">\n",3);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)v,"  <desc>Value of ",0x11);
  poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)v,local_98.first._M_dataplus._M_p,local_98.first._M_string_length)
  ;
  std::__ostream_insert<char,std::char_traits<char>>(poVar10,"</desc>\n",8);
  MVar16 = rtosc::Port::MetaContainer::find(&local_d8,"min");
  rtosc::Port::MetaIterator::MetaIterator((MetaIterator *)&local_f8,(char *)0x0);
  if (MVar16.title == local_f8._M_dataplus._M_p) {
LAB_001095d8:
    MVar16 = rtosc::Port::MetaContainer::find(&local_d8,"enumerated");
    rtosc::Port::MetaIterator::MetaIterator((MetaIterator *)&local_f8,(char *)0x0);
    if (MVar16.title == local_f8._M_dataplus._M_p) {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)v,"  <param_",9);
      poVar10 = std::__ostream_insert<char,std::char_traits<char>>((ostream *)v,(char *)&local_f8,1)
      ;
      std::__ostream_insert<char,std::char_traits<char>>(poVar10," symbol=\"x\"",0xb);
      pcVar13 = rtosc::Port::MetaContainer::operator[](&local_d8,"unit");
      units((ostream *)v,pcVar13);
      lVar11 = 3;
      pcVar13 = "/>\n";
      poVar10 = (ostream *)v;
    }
    else {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)v,"  <param_",9);
      poVar10 = std::__ostream_insert<char,std::char_traits<char>>((ostream *)v,(char *)&local_f8,1)
      ;
      std::__ostream_insert<char,std::char_traits<char>>(poVar10," symbol=\"x\">\n",0xd);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)v,"    <range_min_max min=\"",0x18);
      MVar2.str_ptr = local_d8.str_ptr;
      iVar6 = enum_min(local_d8);
      poVar10 = (ostream *)std::ostream::operator<<((ostream *)v,iVar6);
      std::__ostream_insert<char,std::char_traits<char>>(poVar10,"\" max=\"",7);
      iVar6 = enum_max(MVar2);
      poVar10 = (ostream *)std::ostream::operator<<((ostream *)v,iVar6);
      std::__ostream_insert<char,std::char_traits<char>>(poVar10,"\">\n",3);
      add_options((ostream *)v,MVar2);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)v,"    </range_min_max>\n",0x15)
      ;
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)v,"  </param_",10);
      local_f8._M_dataplus._M_p._0_1_ = uVar12;
      poVar10 = std::__ostream_insert<char,std::char_traits<char>>((ostream *)v,(char *)&local_f8,1)
      ;
      lVar11 = 2;
      pcVar13 = ">\n";
    }
  }
  else {
    MVar16 = rtosc::Port::MetaContainer::find(&local_d8,"max");
    rtosc::Port::MetaIterator::MetaIterator((MetaIterator *)&local_f8,(char *)0x0);
    if (bVar1 || MVar16.title == local_f8._M_dataplus._M_p) goto LAB_001095d8;
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)v,"  <param_",9);
    poVar10 = std::__ostream_insert<char,std::char_traits<char>>((ostream *)v,(char *)&local_f8,1);
    std::__ostream_insert<char,std::char_traits<char>>(poVar10," symbol=\"x\"",0xb);
    pcVar13 = rtosc::Port::MetaContainer::operator[](&local_d8,"unit");
    units((ostream *)v,pcVar13);
    pcVar13 = ">\n";
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)v,">\n",2);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)v,"   <range_min_max ",0x12);
    sVar9 = strlen(pcVar14);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)v,pcVar14,sVar9);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)v," min=\"",6);
    pcVar14 = rtosc::Port::MetaContainer::operator[](&local_d8,"min");
    if (pcVar14 == (char *)0x0) {
      std::ios::clear(iVar6 + (int)*(undefined8 *)(*v + -0x18));
    }
    else {
      sVar9 = strlen(pcVar14);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)v,pcVar14,sVar9);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)v,"\"  max=\"",8);
    pcVar14 = rtosc::Port::MetaContainer::operator[](&local_d8,"max");
    if (pcVar14 == (char *)0x0) {
      std::ios::clear(iVar6 + (int)*(undefined8 *)(*v + -0x18));
    }
    else {
      sVar9 = strlen(pcVar14);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)v,pcVar14,sVar9);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)v,"\"/>\n",4);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)v,"  </param_",10);
    poVar10 = std::__ostream_insert<char,std::char_traits<char>>((ostream *)v,(char *)&local_f8,1);
    lVar11 = 2;
  }
  std::__ostream_insert<char,std::char_traits<char>>(poVar10,pcVar13,lVar11);
  bVar1 = true;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)v," </message_out>\n",0x10);
LAB_0010991f:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98.first._M_dataplus._M_p != &local_98.first.field_2) {
    operator_delete(local_98.first._M_dataplus._M_p,
                    CONCAT71(local_98.first.field_2._M_allocated_capacity._1_7_,
                             local_98.first.field_2._M_local_buf[0]) + 1);
  }
  if (bVar1) {
    std::
    _Rb_tree<std::pair<std::__cxx11::string,std::__cxx11::string>,std::pair<std::__cxx11::string,std::__cxx11::string>,std::_Identity<std::pair<std::__cxx11::string,std::__cxx11::string>>,std::less<std::pair<std::__cxx11::string,std::__cxx11::string>>,std::allocator<std::pair<std::__cxx11::string,std::__cxx11::string>>>
    ::_M_emplace_unique<char_const*&,char_const*const&>
              ((_Rb_tree<std::pair<std::__cxx11::string,std::__cxx11::string>,std::pair<std::__cxx11::string,std::__cxx11::string>,std::_Identity<std::pair<std::__cxx11::string,std::__cxx11::string>>,std::less<std::pair<std::__cxx11::string,std::__cxx11::string>>,std::allocator<std::pair<std::__cxx11::string,std::__cxx11::string>>>
                *)&dump_ports_cb(rtosc::Port_const*,char_const*,char_const*,rtosc::Ports_const&,void*,void*)
                   ::already_dumped_abi_cxx11_,(char **)&local_58,&local_a0->name);
  }
  return;
}

Assistant:

static void dump_ports_cb(const rtosc::Port *p, const char *name,const char*,
                          const Ports&,void *v, void*)
{
    static std::set<std::pair<std::string, std::string>> already_dumped;
    if(already_dumped.find(std::make_pair(name, p->name)) == already_dumped.end())
    {
        bool dumped = do_dump_ports(p, name, v);
        if(dumped)
            already_dumped.emplace(name, p->name);
    }
}